

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idlist.h
# Opt level: O0

int __thiscall
soplex::
IdList<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
::remove(IdList<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
         *this,char *__filename)

{
  int iVar1;
  DLPSV *pDVar2;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar3;
  DLPSV *pDVar4;
  DLPSV **ppDVar5;
  DLPSV *in_stack_ffffffffffffffd8;
  
  pDVar2 = first(this);
  if ((DLPSV *)__filename == pDVar2) {
    pNVar3 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)next(this,in_stack_ffffffffffffffd8);
    (((DLPSV *)this)->
    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).m_elem = pNVar3;
    pDVar2 = first(this);
    if (pDVar2 == (DLPSV *)0x0) {
      (((DLPSV *)this)->
      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).memsize = 0;
      (((DLPSV *)this)->
      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).memused = 0;
      pDVar2 = (DLPSV *)this;
    }
    iVar1 = (int)pDVar2;
  }
  else {
    pDVar2 = (DLPSV *)__filename;
    pDVar4 = last(this);
    if (pDVar2 == pDVar4) {
      ppDVar5 = SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::DLPSV::prev((DLPSV *)__filename);
      *(DLPSV **)
       &(((DLPSV *)this)->
        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).memsize = *ppDVar5;
    }
    else {
      ppDVar5 = SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::DLPSV::prev((DLPSV *)__filename);
      pDVar2 = *ppDVar5;
      ppDVar5 = SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::DLPSV::next((DLPSV *)__filename);
      ppDVar5 = SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::DLPSV::prev(*ppDVar5);
      *ppDVar5 = pDVar2;
      ppDVar5 = SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::DLPSV::next((DLPSV *)__filename);
      pNVar3 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)*ppDVar5;
      ppDVar5 = SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::DLPSV::prev((DLPSV *)__filename);
      this = (IdList<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
              *)SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::DLPSV::next(*ppDVar5);
      (((DLPSV *)this)->
      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).m_elem = pNVar3;
    }
    iVar1 = (int)this;
  }
  return iVar1;
}

Assistant:

void remove(T* elem)
   {
      if(elem == first())
      {
         this->the_first = next(elem);

         if(first() == nullptr)
            this->the_last = nullptr;
      }
      else if(elem == last())
         this->the_last = elem->prev();
      else
      {
         elem->next()->prev() = elem->prev();
         elem->prev()->next() = elem->next();
      }
   }